

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

bool __thiscall google::anon_unknown_1::FlagValue::Equal(FlagValue *this,FlagValue *x)

{
  __type _Var1;
  bool bVar2;
  
  if (this->type_ == x->type_) {
    switch(this->type_) {
    case '\0':
      bVar2 = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x01':
    case '\x02':
      bVar2 = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x03':
    case '\x04':
      bVar2 = *this->value_buffer_ == *x->value_buffer_;
      break;
    case '\x05':
      return (bool)(-(*x->value_buffer_ == *this->value_buffer_) & 1);
    case '\x06':
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this->value_buffer_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              x->value_buffer_);
      return _Var1;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x1b4,
                    "bool google::(anonymous namespace)::FlagValue::Equal(const FlagValue &) const")
      ;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool FlagValue::Equal(const FlagValue& x) const {
  if (type_ != x.type_)
    return false;
  switch (type_) {
    case FV_BOOL:   return VALUE_AS(bool) == OTHER_VALUE_AS(x, bool);
    case FV_INT32:  return VALUE_AS(int32) == OTHER_VALUE_AS(x, int32);
    case FV_UINT32: return VALUE_AS(uint32) == OTHER_VALUE_AS(x, uint32);
    case FV_INT64:  return VALUE_AS(int64) == OTHER_VALUE_AS(x, int64);
    case FV_UINT64: return VALUE_AS(uint64) == OTHER_VALUE_AS(x, uint64);
    case FV_DOUBLE: return VALUE_AS(double) == OTHER_VALUE_AS(x, double);
    case FV_STRING: return VALUE_AS(string) == OTHER_VALUE_AS(x, string);
    default: assert(false); return false;  // unknown type
  }
}